

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

double rcg::getFloat(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,double *vmin,
                    double *vmax,bool exception,bool igncache)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  invalid_argument *piVar5;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  byte in_R8B;
  byte in_R9B;
  undefined8 uVar6;
  GenericException *ex;
  IFloat *val;
  INode *node;
  double ret;
  IBase *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  long *local_1d8;
  allocator local_171;
  string local_170 [32];
  string local_150 [38];
  undefined1 local_12a;
  allocator local_129;
  string local_128 [32];
  string local_108 [38];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [32];
  long *local_a0;
  gcstring local_88 [80];
  long local_38;
  double local_30;
  byte local_22;
  byte local_21;
  undefined8 *local_20;
  undefined8 *local_18;
  char *local_10;
  long lVar4;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  local_30 = 0.0;
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = 0;
  }
  if (in_RCX != (undefined8 *)0x0) {
    *in_RCX = 0;
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  peVar3 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15f285);
  GenICam_3_4::gcstring::gcstring(local_88,local_10);
  iVar2 = (*(peVar3->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar3,local_88);
  lVar4 = CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring(local_88);
  local_38 = lVar4;
  if (lVar4 == 0) {
    if ((local_21 & 1) != 0) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"Feature not found: ",&local_171);
      std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
      std::invalid_argument::invalid_argument(piVar5,local_150);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    bVar1 = GenApi_3_4::IsReadable(in_stack_fffffffffffffdd0);
    if (bVar1) {
      if (local_38 == 0) {
        local_1d8 = (long *)0x0;
      }
      else {
        local_1d8 = (long *)__dynamic_cast(local_38,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
      }
      local_a0 = local_1d8;
      if (local_1d8 == (long *)0x0) {
        if ((local_21 & 1) != 0) {
          local_e2 = 1;
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e0,"Feature not float: ",&local_e1);
          std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
          std::invalid_argument::invalid_argument(piVar5,local_c0);
          local_e2 = 0;
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        local_30 = (double)(**(code **)(*local_1d8 + 0x48))(local_1d8,0,local_22 & 1);
        if (local_18 != (undefined8 *)0x0) {
          uVar6 = (**(code **)(*local_a0 + 0x60))();
          *local_18 = uVar6;
        }
        if (local_20 != (undefined8 *)0x0) {
          uVar6 = (**(code **)(*local_a0 + 0x68))();
          *local_20 = uVar6;
        }
      }
    }
    else if ((local_21 & 1) != 0) {
      local_12a = 1;
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"Feature not readable: ",&local_129);
      std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
      std::invalid_argument::invalid_argument(piVar5,local_108);
      local_12a = 0;
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return local_30;
}

Assistant:

double getFloat(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                double *vmin, double *vmax, bool exception, bool igncache)
{
  double ret=0;

  if (vmin != 0) *vmin=0;
  if (vmax != 0) *vmax=0;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IFloat *val=dynamic_cast<GenApi::IFloat *>(node);

        if (val != 0)
        {
          ret=val->GetValue(false, igncache);

          if (vmin != 0) *vmin=val->GetMin();
          if (vmax != 0) *vmax=val->GetMax();
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not float: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}